

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_257,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>::
     intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
               RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  byte bVar13;
  undefined4 uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  ulong uVar20;
  undefined1 (*pauVar21) [16];
  ulong uVar22;
  long lVar23;
  undefined1 (*pauVar24) [16];
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 in_ZMM9 [64];
  undefined1 auVar47 [64];
  undefined1 in_ZMM10 [64];
  undefined1 auVar49 [64];
  undefined1 in_ZMM11 [64];
  undefined1 auVar51 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  float fStack_2490;
  float fStack_248c;
  float fStack_2488;
  undefined4 uStack_2484;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  undefined4 local_2460;
  undefined4 uStack_245c;
  undefined4 uStack_2458;
  undefined4 uStack_2454;
  undefined4 uStack_2450;
  undefined4 uStack_244c;
  undefined4 uStack_2448;
  undefined4 uStack_2444;
  undefined4 local_2440;
  undefined4 uStack_243c;
  undefined4 uStack_2438;
  undefined4 uStack_2434;
  undefined4 uStack_2430;
  undefined4 uStack_242c;
  undefined4 uStack_2428;
  undefined4 uStack_2424;
  float local_2420;
  float fStack_241c;
  float fStack_2418;
  float fStack_2414;
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  float fStack_2404;
  float local_2400;
  float fStack_23fc;
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float local_23e0;
  float fStack_23dc;
  float fStack_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar46 [64];
  undefined1 auVar48 [64];
  undefined1 auVar50 [64];
  
  pauVar28 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  local_23e0 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_2400 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_2420 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2440 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uStack_243c = local_2440;
  uStack_2438 = local_2440;
  uStack_2434 = local_2440;
  uStack_2430 = local_2440;
  uStack_242c = local_2440;
  uStack_2428 = local_2440;
  uStack_2424 = local_2440;
  local_2460 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  uStack_245c = local_2460;
  uStack_2458 = local_2460;
  uStack_2454 = local_2460;
  uStack_2450 = local_2460;
  uStack_244c = local_2460;
  uStack_2448 = local_2460;
  uStack_2444 = local_2460;
  local_2480 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fStack_247c = local_2480;
  fStack_2478 = local_2480;
  fStack_2474 = local_2480;
  fStack_2470 = local_2480;
  fStack_246c = local_2480;
  fStack_2468 = local_2480;
  fStack_2464 = local_2480;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_23c0._4_4_ = fVar1;
  local_23c0._0_4_ = fVar1;
  local_23c0._8_4_ = fVar1;
  local_23c0._12_4_ = fVar1;
  local_23c0._16_4_ = fVar1;
  local_23c0._20_4_ = fVar1;
  local_23c0._24_4_ = fVar1;
  local_23c0._28_4_ = fVar1;
  auVar53 = ZEXT3264(local_23c0);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_24e0._4_4_ = fVar2;
  local_24e0._0_4_ = fVar2;
  local_24e0._8_4_ = fVar2;
  local_24e0._12_4_ = fVar2;
  local_24e0._16_4_ = fVar2;
  local_24e0._20_4_ = fVar2;
  local_24e0._24_4_ = fVar2;
  local_24e0._28_4_ = fVar2;
  auVar43 = ZEXT3264(local_24e0);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2500._4_4_ = fVar3;
  local_2500._0_4_ = fVar3;
  local_2500._8_4_ = fVar3;
  local_2500._12_4_ = fVar3;
  local_2500._16_4_ = fVar3;
  local_2500._20_4_ = fVar3;
  local_2500._24_4_ = fVar3;
  local_2500._28_4_ = fVar3;
  auVar44 = ZEXT3264(local_2500);
  uVar27 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar26 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar4 = (tray->tnear).field_0.i[k];
  local_2520._4_4_ = iVar4;
  local_2520._0_4_ = iVar4;
  local_2520._8_4_ = iVar4;
  local_2520._12_4_ = iVar4;
  local_2520._16_4_ = iVar4;
  local_2520._20_4_ = iVar4;
  local_2520._24_4_ = iVar4;
  local_2520._28_4_ = iVar4;
  auVar45 = ZEXT3264(local_2520);
  iVar4 = (tray->tfar).field_0.i[k];
  auVar29 = ZEXT3264(CONCAT428(iVar4,CONCAT424(iVar4,CONCAT420(iVar4,CONCAT416(iVar4,CONCAT412(iVar4
                                                  ,CONCAT48(iVar4,CONCAT44(iVar4,iVar4))))))));
  fStack_23dc = local_23e0;
  fStack_23d8 = local_23e0;
  fStack_23d4 = local_23e0;
  fStack_23d0 = local_23e0;
  fStack_23cc = local_23e0;
  fStack_23c8 = local_23e0;
  fStack_23c4 = local_23e0;
  auVar47._0_4_ = fVar1 * -local_23e0;
  auVar47._4_4_ = fVar1 * -local_23e0;
  auVar47._8_4_ = fVar1 * -local_23e0;
  auVar47._12_4_ = fVar1 * -local_23e0;
  auVar47._16_4_ = fVar1 * -local_23e0;
  auVar47._20_4_ = fVar1 * -local_23e0;
  auVar47._28_36_ = in_ZMM9._28_36_;
  auVar47._24_4_ = fVar1 * -local_23e0;
  auVar46 = ZEXT3264(auVar47._0_32_);
  fStack_23fc = local_2400;
  fStack_23f8 = local_2400;
  fStack_23f4 = local_2400;
  fStack_23f0 = local_2400;
  fStack_23ec = local_2400;
  fStack_23e8 = local_2400;
  fStack_23e4 = local_2400;
  auVar49._0_4_ = fVar2 * -local_2400;
  auVar49._4_4_ = fVar2 * -local_2400;
  auVar49._8_4_ = fVar2 * -local_2400;
  auVar49._12_4_ = fVar2 * -local_2400;
  auVar49._16_4_ = fVar2 * -local_2400;
  auVar49._20_4_ = fVar2 * -local_2400;
  auVar49._28_36_ = in_ZMM10._28_36_;
  auVar49._24_4_ = fVar2 * -local_2400;
  auVar48 = ZEXT3264(auVar49._0_32_);
  fStack_241c = local_2420;
  fStack_2418 = local_2420;
  fStack_2414 = local_2420;
  fStack_2410 = local_2420;
  fStack_240c = local_2420;
  fStack_2408 = local_2420;
  fStack_2404 = local_2420;
  local_24a0 = 0x80000000;
  uStack_249c = 0x80000000;
  uStack_2498 = 0x80000000;
  uStack_2494 = 0x80000000;
  fStack_2490 = -0.0;
  fStack_248c = -0.0;
  fStack_2488 = -0.0;
  uStack_2484 = 0x80000000;
  auVar51._0_4_ = fVar3 * -local_2420;
  auVar51._4_4_ = fVar3 * -local_2420;
  auVar51._8_4_ = fVar3 * -local_2420;
  auVar51._12_4_ = fVar3 * -local_2420;
  auVar51._16_4_ = fVar3 * -local_2420;
  auVar51._20_4_ = fVar3 * -local_2420;
  auVar51._28_36_ = in_ZMM11._28_36_;
  auVar51._24_4_ = fVar3 * -local_2420;
  auVar50 = ZEXT3264(auVar51._0_32_);
  local_2540 = auVar47._0_32_;
  local_2560 = auVar49._0_32_;
  local_2580 = auVar51._0_32_;
  while (pauVar19 = pauVar28 + -1, pauVar28 = pauVar28 + -1,
        *(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar19 + 8)) {
LAB_005eef06:
    if (pauVar28 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  }
  uVar15 = *(ulong *)*pauVar28;
LAB_005ee8e2:
  if ((uVar15 & 0xf) == 0) {
    auVar30 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar15 + 0x40 + uVar27),auVar46._0_32_,
                              auVar53._0_32_);
    auVar33 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar15 + 0x40 + uVar26),auVar48._0_32_,
                              auVar43._0_32_);
    auVar11 = vpmaxsd_avx2(ZEXT1632(auVar30),ZEXT1632(auVar33));
    auVar30 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar15 + 0x40 + uVar22),auVar50._0_32_,
                              auVar44._0_32_);
    auVar33 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar15 + 0x40 + (uVar27 ^ 0x20)),auVar46._0_32_
                              ,auVar53._0_32_);
    auVar35 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar15 + 0x40 + (uVar26 ^ 0x20)),auVar48._0_32_
                              ,auVar43._0_32_);
    auVar32 = vpminsd_avx2(ZEXT1632(auVar33),ZEXT1632(auVar35));
    auVar33 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar15 + 0x40 + (uVar22 ^ 0x20)),auVar50._0_32_
                              ,auVar44._0_32_);
    auVar12 = vpmaxsd_avx2(ZEXT1632(auVar30),auVar45._0_32_);
    local_25a0 = vpmaxsd_avx2(auVar11,auVar12);
    auVar11 = vpminsd_avx2(ZEXT1632(auVar33),auVar29._0_32_);
    auVar11 = vpminsd_avx2(auVar32,auVar11);
    auVar11 = vpcmpgtd_avx2(local_25a0,auVar11);
    uVar14 = vmovmskps_avx(auVar11);
    bVar13 = ~(byte)uVar14;
  }
  else {
    if ((int)(uVar15 & 0xf) != 2) {
      in_ZMM12 = ZEXT1664(in_ZMM12._0_16_);
      (**(code **)((long)This->leafIntersector +
                  (ulong)*(byte *)(uVar15 & 0xfffffffffffffff0) * 0x40 + 0x10))(pre,ray,k,context);
      auVar53 = ZEXT3264(local_23c0);
      uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar29 = ZEXT3264(CONCAT428(uVar14,CONCAT424(uVar14,CONCAT420(uVar14,CONCAT416(uVar14,
                                                  CONCAT412(uVar14,CONCAT48(uVar14,CONCAT44(uVar14,
                                                  uVar14))))))));
      auVar43 = ZEXT3264(local_24e0);
      auVar44 = ZEXT3264(local_2500);
      auVar45 = ZEXT3264(local_2520);
      auVar46 = ZEXT3264(local_2540);
      auVar48 = ZEXT3264(local_2560);
      auVar50 = ZEXT3264(local_2580);
      goto LAB_005eef06;
    }
    uVar25 = uVar15 & 0xfffffffffffffff0;
    auVar11 = *(undefined1 (*) [32])(uVar25 + 0x100);
    auVar43._0_4_ = local_2480 * auVar11._0_4_;
    auVar43._4_4_ = fStack_247c * auVar11._4_4_;
    auVar43._8_4_ = fStack_2478 * auVar11._8_4_;
    auVar43._12_4_ = fStack_2474 * auVar11._12_4_;
    auVar43._16_4_ = fStack_2470 * auVar11._16_4_;
    auVar43._20_4_ = fStack_246c * auVar11._20_4_;
    auVar43._28_36_ = auVar45._28_36_;
    auVar43._24_4_ = fStack_2468 * auVar11._24_4_;
    auVar12 = *(undefined1 (*) [32])(uVar25 + 0x120);
    auVar44._0_4_ = local_2480 * auVar12._0_4_;
    auVar44._4_4_ = fStack_247c * auVar12._4_4_;
    auVar44._8_4_ = fStack_2478 * auVar12._8_4_;
    auVar44._12_4_ = fStack_2474 * auVar12._12_4_;
    auVar44._16_4_ = fStack_2470 * auVar12._16_4_;
    auVar44._20_4_ = fStack_246c * auVar12._20_4_;
    auVar44._28_36_ = auVar50._28_36_;
    auVar44._24_4_ = fStack_2468 * auVar12._24_4_;
    auVar32 = *(undefined1 (*) [32])(uVar25 + 0x140);
    auVar45._0_4_ = local_2480 * auVar32._0_4_;
    auVar45._4_4_ = fStack_247c * auVar32._4_4_;
    auVar45._8_4_ = fStack_2478 * auVar32._8_4_;
    auVar45._12_4_ = fStack_2474 * auVar32._12_4_;
    auVar45._16_4_ = fStack_2470 * auVar32._16_4_;
    auVar45._20_4_ = fStack_246c * auVar32._20_4_;
    auVar45._28_36_ = in_ZMM12._28_36_;
    auVar45._24_4_ = fStack_2468 * auVar32._24_4_;
    local_24c0 = *(undefined1 (*) [32])(uVar25 + 0x80);
    auVar7._4_4_ = uStack_245c;
    auVar7._0_4_ = local_2460;
    auVar7._8_4_ = uStack_2458;
    auVar7._12_4_ = uStack_2454;
    auVar7._16_4_ = uStack_2450;
    auVar7._20_4_ = uStack_244c;
    auVar7._24_4_ = uStack_2448;
    auVar7._28_4_ = uStack_2444;
    auVar30 = vfmadd231ps_fma(auVar43._0_32_,auVar7,*(undefined1 (*) [32])(uVar25 + 0xa0));
    auVar33 = vfmadd231ps_fma(auVar44._0_32_,auVar7,*(undefined1 (*) [32])(uVar25 + 0xc0));
    auVar35 = vfmadd231ps_fma(auVar45._0_32_,auVar7,*(undefined1 (*) [32])(uVar25 + 0xe0));
    auVar8._4_4_ = uStack_243c;
    auVar8._0_4_ = local_2440;
    auVar8._8_4_ = uStack_2438;
    auVar8._12_4_ = uStack_2434;
    auVar8._16_4_ = uStack_2430;
    auVar8._20_4_ = uStack_242c;
    auVar8._24_4_ = uStack_2428;
    auVar8._28_4_ = uStack_2424;
    auVar30 = vfmadd231ps_fma(ZEXT1632(auVar30),auVar8,*(undefined1 (*) [32])(uVar25 + 0x40));
    auVar33 = vfmadd231ps_fma(ZEXT1632(auVar33),auVar8,*(undefined1 (*) [32])(uVar25 + 0x60));
    auVar35 = vfmadd231ps_fma(ZEXT1632(auVar35),auVar8,local_24c0);
    auVar52._8_4_ = 0x7fffffff;
    auVar52._0_8_ = 0x7fffffff7fffffff;
    auVar52._12_4_ = 0x7fffffff;
    auVar52._16_4_ = 0x7fffffff;
    auVar52._20_4_ = 0x7fffffff;
    auVar52._24_4_ = 0x7fffffff;
    auVar52._28_4_ = 0x7fffffff;
    auVar7 = vandps_avx(ZEXT1632(auVar30),auVar52);
    auVar37._8_4_ = 0x219392ef;
    auVar37._0_8_ = 0x219392ef219392ef;
    auVar37._12_4_ = 0x219392ef;
    auVar37._16_4_ = 0x219392ef;
    auVar37._20_4_ = 0x219392ef;
    auVar37._24_4_ = 0x219392ef;
    auVar37._28_4_ = 0x219392ef;
    auVar7 = vcmpps_avx(auVar7,auVar37,1);
    auVar8 = vblendvps_avx(ZEXT1632(auVar30),auVar37,auVar7);
    auVar7 = vandps_avx(ZEXT1632(auVar33),auVar52);
    auVar7 = vcmpps_avx(auVar7,auVar37,1);
    auVar9 = vblendvps_avx(ZEXT1632(auVar33),auVar37,auVar7);
    auVar7 = vandps_avx(ZEXT1632(auVar35),auVar52);
    auVar7 = vcmpps_avx(auVar7,auVar37,1);
    auVar7 = vblendvps_avx(ZEXT1632(auVar35),auVar37,auVar7);
    auVar34 = vrcpps_avx(auVar8);
    auVar38._8_4_ = 0x3f800000;
    auVar38._0_8_ = 0x3f8000003f800000;
    auVar38._12_4_ = 0x3f800000;
    auVar38._16_4_ = 0x3f800000;
    auVar38._20_4_ = 0x3f800000;
    auVar38._24_4_ = 0x3f800000;
    auVar38._28_4_ = 0x3f800000;
    auVar30 = vfnmadd213ps_fma(auVar8,auVar34,auVar38);
    auVar8 = vrcpps_avx(auVar9);
    auVar30 = vfmadd132ps_fma(ZEXT1632(auVar30),auVar34,auVar34);
    auVar34 = vrcpps_avx(auVar7);
    auVar33 = vfnmadd213ps_fma(auVar9,auVar8,auVar38);
    auVar33 = vfmadd132ps_fma(ZEXT1632(auVar33),auVar8,auVar8);
    auVar35 = vfnmadd213ps_fma(auVar7,auVar34,auVar38);
    auVar35 = vfmadd132ps_fma(ZEXT1632(auVar35),auVar34,auVar34);
    in_ZMM12 = ZEXT1664(auVar35);
    auVar9._4_4_ = fStack_241c;
    auVar9._0_4_ = local_2420;
    auVar9._8_4_ = fStack_2418;
    auVar9._12_4_ = fStack_2414;
    auVar9._16_4_ = fStack_2410;
    auVar9._20_4_ = fStack_240c;
    auVar9._24_4_ = fStack_2408;
    auVar9._28_4_ = fStack_2404;
    auVar31 = vfmadd213ps_fma(auVar11,auVar9,*(undefined1 (*) [32])(uVar25 + 0x160));
    auVar40 = vfmadd213ps_fma(auVar12,auVar9,*(undefined1 (*) [32])(uVar25 + 0x180));
    auVar11._4_4_ = fStack_23fc;
    auVar11._0_4_ = local_2400;
    auVar11._8_4_ = fStack_23f8;
    auVar11._12_4_ = fStack_23f4;
    auVar11._16_4_ = fStack_23f0;
    auVar11._20_4_ = fStack_23ec;
    auVar11._24_4_ = fStack_23e8;
    auVar11._28_4_ = fStack_23e4;
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar31),auVar11,*(undefined1 (*) [32])(uVar25 + 0xa0));
    auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar11,*(undefined1 (*) [32])(uVar25 + 0xc0));
    auVar31 = vfmadd213ps_fma(auVar32,auVar9,*(undefined1 (*) [32])(uVar25 + 0x1a0));
    auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),auVar11,*(undefined1 (*) [32])(uVar25 + 0xe0));
    auVar12._4_4_ = fStack_23dc;
    auVar12._0_4_ = local_23e0;
    auVar12._8_4_ = fStack_23d8;
    auVar12._12_4_ = fStack_23d4;
    auVar12._16_4_ = fStack_23d0;
    auVar12._20_4_ = fStack_23cc;
    auVar12._24_4_ = fStack_23c8;
    auVar12._28_4_ = fStack_23c4;
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar12,*(undefined1 (*) [32])(uVar25 + 0x40));
    auVar36._0_4_ = auVar10._0_4_ * (float)((uint)auVar30._0_4_ ^ local_24a0);
    auVar36._4_4_ = auVar10._4_4_ * (float)((uint)auVar30._4_4_ ^ uStack_249c);
    auVar36._8_4_ = auVar10._8_4_ * (float)((uint)auVar30._8_4_ ^ uStack_2498);
    auVar36._12_4_ = auVar10._12_4_ * (float)((uint)auVar30._12_4_ ^ uStack_2494);
    auVar36._16_4_ = fStack_2490 * 0.0;
    auVar36._20_4_ = fStack_248c * 0.0;
    auVar36._24_4_ = fStack_2488 * 0.0;
    auVar36._28_4_ = 0;
    auVar40 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar12,*(undefined1 (*) [32])(uVar25 + 0x60));
    auVar34._0_4_ = auVar40._0_4_ * (float)((uint)auVar33._0_4_ ^ local_24a0);
    auVar34._4_4_ = auVar40._4_4_ * (float)((uint)auVar33._4_4_ ^ uStack_249c);
    auVar34._8_4_ = auVar40._8_4_ * (float)((uint)auVar33._8_4_ ^ uStack_2498);
    auVar34._12_4_ = auVar40._12_4_ * (float)((uint)auVar33._12_4_ ^ uStack_2494);
    auVar34._16_4_ = fStack_2490 * 0.0;
    auVar34._20_4_ = fStack_248c * 0.0;
    auVar34._24_4_ = fStack_2488 * 0.0;
    auVar34._28_4_ = 0;
    auVar31 = vfmadd231ps_fma(ZEXT1632(auVar31),auVar12,local_24c0);
    auVar32._0_4_ = auVar31._0_4_ * (float)((uint)auVar35._0_4_ ^ local_24a0);
    auVar32._4_4_ = auVar31._4_4_ * (float)((uint)auVar35._4_4_ ^ uStack_249c);
    auVar32._8_4_ = auVar31._8_4_ * (float)((uint)auVar35._8_4_ ^ uStack_2498);
    auVar32._12_4_ = auVar31._12_4_ * (float)((uint)auVar35._12_4_ ^ uStack_2494);
    auVar32._16_4_ = fStack_2490 * 0.0;
    auVar32._20_4_ = fStack_248c * 0.0;
    auVar32._24_4_ = fStack_2488 * 0.0;
    auVar32._28_4_ = 0;
    auVar39._0_4_ = auVar30._0_4_ + auVar36._0_4_;
    auVar39._4_4_ = auVar30._4_4_ + auVar36._4_4_;
    auVar39._8_4_ = auVar30._8_4_ + auVar36._8_4_;
    auVar39._12_4_ = auVar30._12_4_ + auVar36._12_4_;
    auVar39._16_4_ = auVar36._16_4_ + 0.0;
    auVar39._20_4_ = auVar36._20_4_ + 0.0;
    auVar39._24_4_ = auVar36._24_4_ + 0.0;
    auVar39._28_4_ = 0;
    auVar41._0_4_ = auVar33._0_4_ + auVar34._0_4_;
    auVar41._4_4_ = auVar33._4_4_ + auVar34._4_4_;
    auVar41._8_4_ = auVar33._8_4_ + auVar34._8_4_;
    auVar41._12_4_ = auVar33._12_4_ + auVar34._12_4_;
    auVar41._16_4_ = auVar34._16_4_ + 0.0;
    auVar41._20_4_ = auVar34._20_4_ + 0.0;
    auVar41._24_4_ = auVar34._24_4_ + 0.0;
    auVar41._28_4_ = 0;
    auVar42._0_4_ = auVar35._0_4_ + auVar32._0_4_;
    auVar42._4_4_ = auVar35._4_4_ + auVar32._4_4_;
    auVar42._8_4_ = auVar35._8_4_ + auVar32._8_4_;
    auVar42._12_4_ = auVar35._12_4_ + auVar32._12_4_;
    auVar42._16_4_ = auVar32._16_4_ + 0.0;
    auVar42._20_4_ = auVar32._20_4_ + 0.0;
    auVar42._24_4_ = auVar32._24_4_ + 0.0;
    auVar42._28_4_ = 0;
    auVar11 = vpminsd_avx2(auVar34,auVar41);
    auVar12 = vpminsd_avx2(auVar32,auVar42);
    auVar11 = vmaxps_avx(auVar11,auVar12);
    auVar8 = vpminsd_avx2(auVar36,auVar39);
    auVar7 = vpmaxsd_avx2(auVar36,auVar39);
    auVar12 = vpmaxsd_avx2(auVar34,auVar41);
    auVar32 = vpmaxsd_avx2(auVar32,auVar42);
    auVar32 = vminps_avx(auVar12,auVar32);
    auVar12 = vmaxps_avx(local_2520,auVar8);
    auVar45 = ZEXT3264(local_2520);
    local_25a0 = vmaxps_avx(auVar12,auVar11);
    auVar11 = vminps_avx(auVar29._0_32_,auVar7);
    auVar11 = vminps_avx(auVar11,auVar32);
    auVar11 = vcmpps_avx(local_25a0,auVar11,2);
    uVar14 = vmovmskps_avx(auVar11);
    bVar13 = (byte)uVar14;
    auVar43 = ZEXT3264(local_24e0);
    auVar44 = ZEXT3264(local_2500);
    auVar46 = ZEXT3264(local_2540);
    auVar48 = ZEXT3264(local_2560);
    auVar50 = ZEXT3264(local_2580);
  }
  if (bVar13 == 0) goto LAB_005eef06;
  uVar25 = uVar15 & 0xfffffffffffffff0;
  lVar16 = 0;
  for (uVar15 = (ulong)bVar13; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
    lVar16 = lVar16 + 1;
  }
  uVar15 = *(ulong *)(uVar25 + lVar16 * 8);
  uVar17 = bVar13 - 1 & (uint)bVar13;
  uVar20 = (ulong)uVar17;
  if (uVar17 != 0) {
    uVar5 = *(uint *)(local_25a0 + lVar16 * 4);
    lVar16 = 0;
    for (; (uVar20 & 1) == 0; uVar20 = uVar20 >> 1 | 0x8000000000000000) {
      lVar16 = lVar16 + 1;
    }
    uVar17 = uVar17 - 1 & uVar17;
    uVar18 = (ulong)uVar17;
    uVar20 = *(ulong *)(uVar25 + lVar16 * 8);
    uVar6 = *(uint *)(local_25a0 + lVar16 * 4);
    if (uVar17 == 0) {
      if (uVar5 < uVar6) {
        *(ulong *)*pauVar28 = uVar20;
        *(uint *)(*pauVar28 + 8) = uVar6;
        pauVar28 = pauVar28 + 1;
      }
      else {
        *(ulong *)*pauVar28 = uVar15;
        *(uint *)(*pauVar28 + 8) = uVar5;
        uVar15 = uVar20;
        pauVar28 = pauVar28 + 1;
      }
    }
    else {
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar15;
      auVar30 = vpunpcklqdq_avx(auVar30,ZEXT416(uVar5));
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar20;
      auVar33 = vpunpcklqdq_avx(auVar33,ZEXT416(uVar6));
      lVar16 = 0;
      for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
        lVar16 = lVar16 + 1;
      }
      uVar17 = uVar17 - 1 & uVar17;
      uVar15 = (ulong)uVar17;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = *(ulong *)(uVar25 + lVar16 * 8);
      auVar31 = vpunpcklqdq_avx(auVar35,ZEXT416(*(uint *)(local_25a0 + lVar16 * 4)));
      auVar35 = vpcmpgtd_avx(auVar33,auVar30);
      if (uVar17 == 0) {
        auVar40 = vpshufd_avx(auVar35,0xaa);
        auVar35 = vblendvps_avx(auVar33,auVar30,auVar40);
        auVar30 = vblendvps_avx(auVar30,auVar33,auVar40);
        auVar33 = vpcmpgtd_avx(auVar31,auVar35);
        auVar40 = vpshufd_avx(auVar33,0xaa);
        auVar33 = vblendvps_avx(auVar31,auVar35,auVar40);
        auVar35 = vblendvps_avx(auVar35,auVar31,auVar40);
        auVar31 = vpcmpgtd_avx(auVar35,auVar30);
        auVar40 = vpshufd_avx(auVar31,0xaa);
        auVar31 = vblendvps_avx(auVar35,auVar30,auVar40);
        auVar30 = vblendvps_avx(auVar30,auVar35,auVar40);
        *pauVar28 = auVar30;
        pauVar28[1] = auVar31;
        uVar15 = auVar33._0_8_;
        pauVar28 = pauVar28 + 2;
      }
      else {
        in_ZMM12 = ZEXT3264(auVar50._0_32_);
        lVar16 = 0;
        for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
          lVar16 = lVar16 + 1;
        }
        uVar17 = uVar17 - 1 & uVar17;
        uVar20 = (ulong)uVar17;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = *(ulong *)(uVar25 + lVar16 * 8);
        auVar40 = vpunpcklqdq_avx(auVar40,ZEXT416(*(uint *)(local_25a0 + lVar16 * 4)));
        if (uVar17 == 0) {
          auVar10 = vpshufd_avx(auVar35,0xaa);
          auVar35 = vblendvps_avx(auVar33,auVar30,auVar10);
          auVar30 = vblendvps_avx(auVar30,auVar33,auVar10);
          auVar33 = vpcmpgtd_avx(auVar40,auVar31);
          auVar10 = vpshufd_avx(auVar33,0xaa);
          auVar33 = vblendvps_avx(auVar40,auVar31,auVar10);
          auVar31 = vblendvps_avx(auVar31,auVar40,auVar10);
          auVar40 = vpcmpgtd_avx(auVar31,auVar30);
          auVar10 = vpshufd_avx(auVar40,0xaa);
          auVar40 = vblendvps_avx(auVar31,auVar30,auVar10);
          auVar30 = vblendvps_avx(auVar30,auVar31,auVar10);
          auVar31 = vpcmpgtd_avx(auVar33,auVar35);
          auVar10 = vpshufd_avx(auVar31,0xaa);
          auVar31 = vblendvps_avx(auVar33,auVar35,auVar10);
          auVar33 = vblendvps_avx(auVar35,auVar33,auVar10);
          auVar35 = vpcmpgtd_avx(auVar40,auVar33);
          auVar10 = vpshufd_avx(auVar35,0xaa);
          auVar35 = vblendvps_avx(auVar40,auVar33,auVar10);
          auVar33 = vblendvps_avx(auVar33,auVar40,auVar10);
          *pauVar28 = auVar30;
          pauVar28[1] = auVar33;
          pauVar28[2] = auVar35;
          uVar15 = auVar31._0_8_;
          pauVar19 = pauVar28 + 3;
        }
        else {
          *pauVar28 = auVar30;
          pauVar28[1] = auVar33;
          pauVar28[2] = auVar31;
          pauVar28[3] = auVar40;
          lVar16 = 0x30;
          do {
            lVar23 = lVar16;
            lVar16 = 0;
            for (uVar15 = uVar20; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
              lVar16 = lVar16 + 1;
            }
            uVar15 = *(ulong *)(uVar25 + lVar16 * 8);
            auVar31._8_8_ = 0;
            auVar31._0_8_ = uVar15;
            auVar30 = vpunpcklqdq_avx(auVar31,ZEXT416(*(uint *)(local_25a0 + lVar16 * 4)));
            *(undefined1 (*) [16])(pauVar28[1] + lVar23) = auVar30;
            uVar20 = uVar20 - 1 & uVar20;
            lVar16 = lVar23 + 0x10;
          } while (uVar20 != 0);
          pauVar19 = (undefined1 (*) [16])(pauVar28[1] + lVar23);
          if (lVar23 + 0x10 != 0) {
            lVar16 = 0x10;
            pauVar21 = pauVar28;
            do {
              auVar30 = pauVar21[1];
              pauVar21 = pauVar21 + 1;
              uVar17 = vextractps_avx(auVar30,2);
              lVar23 = lVar16;
              do {
                if (uVar17 <= *(uint *)(pauVar28[-1] + lVar23 + 8)) {
                  pauVar24 = (undefined1 (*) [16])(*pauVar28 + lVar23);
                  break;
                }
                *(undefined1 (*) [16])(*pauVar28 + lVar23) =
                     *(undefined1 (*) [16])(pauVar28[-1] + lVar23);
                lVar23 = lVar23 + -0x10;
                pauVar24 = pauVar28;
              } while (lVar23 != 0);
              *pauVar24 = auVar30;
              lVar16 = lVar16 + 0x10;
            } while (pauVar19 != pauVar21);
            uVar15 = *(ulong *)*pauVar19;
          }
        }
        auVar43 = ZEXT3264(auVar43._0_32_);
        auVar44 = ZEXT3264(auVar44._0_32_);
        auVar45 = ZEXT3264(auVar45._0_32_);
        auVar46 = ZEXT3264(auVar46._0_32_);
        auVar48 = ZEXT3264(auVar48._0_32_);
        auVar50 = ZEXT3264(auVar50._0_32_);
        pauVar28 = pauVar19;
      }
    }
  }
  goto LAB_005ee8e2;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }